

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_intersect.cpp
# Opt level: O1

bool ON_Intersect(ON_BoundingBox *bbox,ON_Line *line,double tol,ON_Interval *line_parameters)

{
  ON_3dPoint *this;
  ON_3dPoint from_pt;
  ON_3dPoint to_pt;
  int i;
  double *pdVar1;
  int iVar2;
  bool bVar3;
  int i_00;
  int i_01;
  undefined4 uVar4;
  undefined4 uVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  ON_3dVector v;
  ON_Line chord;
  double local_120;
  double local_118;
  double local_108;
  double local_f8;
  ON_3dPoint local_c0;
  ON_3dVector local_a8;
  ON_Line local_90;
  ON_3dPoint local_60;
  ON_3dPoint local_48;
  
  ON_Line::Direction(&local_a8,line);
  i = ON_3dVector::MaximumCoordinateIndex(&local_a8);
  dVar9 = ON_3dPoint::operator[](&line->from,i);
  dVar10 = ON_3dPoint::operator[](&line->to,i);
  local_f8 = ON_3dPoint::operator[](&bbox->m_min,i);
  this = &bbox->m_max;
  local_108 = ON_3dPoint::operator[](this,i);
  if (local_108 < local_f8) {
    return false;
  }
  dVar7 = (double)(-(ulong)(0.0 <= tol) & (ulong)tol);
  local_f8 = local_f8 - (dVar7 + dVar9);
  local_108 = (dVar7 - dVar9) + local_108;
  if (local_108 < local_f8) {
    return false;
  }
  dVar10 = dVar10 - dVar9;
  if ((dVar10 == 0.0) && (!NAN(dVar10))) {
    if ((local_f8 <= 0.0) && (0.0 <= local_108)) {
      return false;
    }
    if (line_parameters != (ON_Interval *)0x0) {
      ON_Interval::Set(line_parameters,0.0,0.0);
      return true;
    }
    return true;
  }
  if (ABS(dVar10) < 1.0) {
    dVar9 = ABS(dVar10) * 1e+308;
    if (dVar9 <= ABS(local_f8)) {
      return false;
    }
    if (dVar9 <= ABS(local_108)) {
      return false;
    }
  }
  local_f8 = local_f8 * (1.0 / dVar10);
  local_108 = (1.0 / dVar10) * local_108;
  ON_Line::PointAt(&local_48,line,local_f8);
  ON_Line::PointAt(&local_60,line,local_108);
  from_pt.y = local_48.y;
  from_pt.x = local_48.x;
  from_pt.z = local_48.z;
  to_pt.y = local_60.y;
  to_pt.x = local_60.x;
  to_pt.z = local_60.z;
  ON_Line::ON_Line(&local_90,from_pt,to_pt);
  pdVar1 = ON_3dVector::operator[](&local_a8,(i + 1) % 3);
  dVar9 = *pdVar1;
  pdVar1 = ON_3dVector::operator[](&local_a8,(i + 2) % 3);
  i_01 = (int)((i - (uint)(ABS(*pdVar1) < ABS(dVar9))) + 2) % 3;
  pdVar1 = ON_3dPoint::operator[](&local_90.from,i_01);
  dVar9 = *pdVar1;
  pdVar1 = ON_3dPoint::operator[](&local_90.to,i_01);
  dVar10 = *pdVar1;
  local_118 = ON_3dPoint::operator[](&bbox->m_min,i_01);
  dVar6 = ON_3dPoint::operator[](this,i_01);
  if (local_118 <= dVar6) {
    local_118 = local_118 - (dVar7 + dVar9);
    dVar6 = (dVar7 - dVar9) + dVar6;
    if (((local_118 <= dVar6) &&
        ((dVar10 = dVar10 - dVar9, local_118 <= 0.0 || (local_118 <= dVar10)))) &&
       ((0.0 <= dVar6 || (dVar10 <= dVar6)))) {
      if ((1.0 <= ABS(dVar10)) ||
         ((dVar9 = ABS(dVar10) * 1e+308, ABS(local_118) <= dVar9 && (ABS(dVar6) <= dVar9)))) {
        local_118 = local_118 * (1.0 / dVar10);
        dVar6 = (1.0 / dVar10) * dVar6;
        if (local_118 <= 1.0) {
          if ((0.0 <= local_118) || (local_118 = 0.0, 0.0 <= dVar6)) goto LAB_004be2ce;
        }
        else {
          local_118 = 1.0;
          if (dVar6 <= 1.0) {
LAB_004be2ce:
            local_120 = 0.0;
            if ((0.0 <= dVar6) && (local_120 = dVar6, 1.0 < dVar6)) {
              local_120 = 1.0;
            }
            ON_Line::PointAt(&local_c0,&local_90,local_118);
            ON_3dVector::operator=(&local_a8,&local_c0);
            ON_Line::PointAt(&local_c0,&local_90,local_120);
            local_90.to.z = local_c0.z;
            local_90.to.x = local_c0.x;
            local_90.to.y = local_c0.y;
            ON_3dPoint::operator=(&local_90.from,&local_a8);
            dVar9 = local_118 * local_108;
            local_108 = local_108 * local_120 + (1.0 - local_120) * local_f8;
            local_f8 = (1.0 - local_118) * local_f8 + dVar9;
          }
        }
      }
      iVar2 = 2 - (uint)(i_01 != 1 && i != 1);
      i_00 = 0;
      if (i_01 == 0) {
        i_00 = iVar2;
      }
      if (i == 0) {
        i_00 = iVar2;
      }
      pdVar1 = ON_3dPoint::operator[](&local_90.from,i_00);
      dVar9 = *pdVar1;
      pdVar1 = ON_3dPoint::operator[](&local_90.to,i_00);
      dVar10 = *pdVar1;
      dVar6 = ON_3dPoint::operator[](&bbox->m_min,i_00);
      dVar8 = ON_3dPoint::operator[](this,i_00);
      if (dVar6 <= dVar8) {
        dVar6 = dVar6 - (dVar7 + dVar9);
        dVar8 = (dVar7 - dVar9) + dVar8;
        if (((dVar6 <= dVar8) && ((dVar10 = dVar10 - dVar9, dVar6 <= 0.0 || (dVar6 <= dVar10)))) &&
           ((0.0 <= dVar8 || (dVar10 <= dVar8)))) {
          bVar3 = true;
          if (line_parameters == (ON_Interval *)0x0) goto LAB_004be49c;
          if ((1.0 <= ABS(dVar10)) ||
             ((dVar9 = ABS(dVar10) * 1e+308, ABS(dVar6) <= dVar9 && (ABS(dVar8) <= dVar9)))) {
            dVar6 = dVar6 * (1.0 / dVar10);
            dVar8 = (1.0 / dVar10) * dVar8;
            if (dVar6 <= 1.0) {
              if ((0.0 <= dVar6) || (dVar6 = 0.0, 0.0 <= dVar8)) goto LAB_004be554;
            }
            else {
              dVar6 = 1.0;
              if (dVar8 <= 1.0) {
LAB_004be554:
                dVar9 = 0.0;
                if ((0.0 <= dVar8) && (dVar9 = dVar8, 1.0 < dVar8)) {
                  dVar9 = 1.0;
                }
                dVar10 = dVar6 * local_108;
                local_108 = local_108 * dVar9 + (1.0 - dVar9) * local_f8;
                local_f8 = (1.0 - dVar6) * local_f8 + dVar10;
              }
            }
          }
          uVar4 = SUB84(local_108,0);
          uVar5 = (undefined4)((ulong)local_108 >> 0x20);
          if (local_f8 <= local_108) {
            uVar4 = SUB84(local_f8,0);
            uVar5 = (undefined4)((ulong)local_f8 >> 0x20);
            local_f8 = local_108;
          }
          ON_Interval::Set(line_parameters,(double)CONCAT44(uVar5,uVar4),local_f8);
          goto LAB_004be49c;
        }
      }
    }
  }
  bVar3 = false;
LAB_004be49c:
  ON_Line::~ON_Line(&local_90);
  return bVar3;
}

Assistant:

bool ON_Intersect( const ON_BoundingBox& bbox, 
                   const ON_Line& line, 
                   double tol,
                   ON_Interval* line_parameters)
{
  double a,b,d,mn,mx,s0,s1, t0, t1;
  const double M = 1.0e308;

  // i,j,k are indices of coordinates to trim.
  // trim the direction with the biggest line deltas first
  ON_3dVector v = line.Direction();
  const int i = v.MaximumCoordinateIndex();

  // guard against ON_UNSET_VALUE as input
  if ( !(tol >= 0.0) )
    tol = 0.0;

  // clip i-th coordinate
  a = line.from[i];
  b = line.to[i];
  mn = bbox.m_min[i];
  mx = bbox.m_max[i];
  if ( !(mn <= mx) )
    return false;
  mn -= (tol+a);
  mx += (tol-a);
  if ( !(mn <= mx) )
    return false;
  d = b-a;
  if ( 0.0 == d )
  {
    // happens when line.from == line.to
    if ( 0.0 < mn || 0.0 > mx )
    {
      // point is in box
      if ( line_parameters )
      {
        // setting parameters makes no sense - just use 0.0
        // so it's clear we have a point
        line_parameters->Set(0.0,0.0);
      }
      return true;
    }
    return false; // point is outside box
  }
  if ( fabs(d) < 1.0 && (fabs(mn) >= fabs(d)*M || fabs(mx) >= fabs(d)*M) )
  {
    // the value of mn/d or mx/d is too large for a realistic answer to be computed
    return false;
  }
  d = 1.0/d;
  t0 = mn*d;
  t1 = mx*d;

  // set "chord" = line segment that begins and ends on the
  // i-th coordinate box side planes.
  ON_Line chord(line.PointAt(t0),line.PointAt(t1));

  // test j-th coordinate direction
  const int j = (i + (fabs(v[(i+1)%3])>fabs(v[(i+2)%3])?1:2) ) % 3;
  a = chord.from[j];
  b = chord.to[j];
  mn = bbox.m_min[j];
  mx = bbox.m_max[j];
  if ( !(mn <= mx) )
    return false;
  mn -= (tol+a);
  mx += (tol-a);
  if ( !(mn <= mx) )
    return false;
  d = b-a;
  if ( (0.0 < mn && d < mn) || (0.0 > mx && d > mx) )
  {
    // chord lies outside the box
    return false;
  }

  while ( fabs(d) >= 1.0 || (fabs(mn) <= fabs(d)*M && fabs(mx) <= fabs(d)*M) )
  {
    // The chord is not (nearly) parallel to the j-th sides.
    // See if the chord needs to be trimmed by the j-th sides.
    d = 1.0/d;
    s0 = mn*d;
    s1 = mx*d;
    if ( s0 > 1.0 )
    {
      if ( s1 > 1.0 )
      {
        // unstable calculation happens when
        // fabs(d) is very tiny and chord is
        // on the j-th side.
        break;
      }
      s0 = 1.0;
    }
    else if ( s0 < 0.0 )
    {
      if (s1 < 0.0)
      {
        // unstable calculation happens when
        // fabs(d) is very tiny and chord is
        // on the j-th side.
        break;
      }
      s0 = 0.0;
    }
    if ( s1 < 0.0 ) s1 = 0.0; else if ( s1 > 1.0 ) s1 = 1.0;
    d = (1.0-s0)*t0 + s0*t1;
    t1 = (1.0-s1)*t0 + s1*t1;
    t0 = d;
    v = chord.PointAt(s0);
    chord.to = chord.PointAt(s1);
    chord.from = v;
    break;
  }
  
  // test k-th coordinate direction
  const int k = (i&&j) ? 0 : ((i!=1&&j!=1)?1:2);
  a = chord.from[k];
  b = chord.to[k];
  mn = bbox.m_min[k];
  mx = bbox.m_max[k];
  if ( !(mn <= mx) )
    return false;
  mn -= (tol+a);
  mx += (tol-a);
  if ( !(mn <= mx) )
    return false;
  d = b-a;
  if ( (0.0 < mn && d < mn) || (0.0 > mx && d > mx) )
  {
    // chord does not intersect the rectangle
    return false;
  }

  if ( line_parameters )
  {

    while ( fabs(d) >= 1.0 || (fabs(mn) <= fabs(d)*M && fabs(mx) <= fabs(d)*M) )
    {
      // The chord is not (nearly) parallel to the k-th sides.
      // See if the chord needs to be trimmed by the k-th sides.
      d = 1.0/d;
      s0 = mn*d;
      s1 = mx*d;
      if ( s0 > 1.0 )
      {
        if ( s1 > 1.0 )
        {
          // unstable calculation happens when
          // fabs(d) is very tiny and chord is
          // on the k-th side.
          break;
        }
        s0 = 1.0;
      }
      else if ( s0 < 0.0 )
      {
        if (s1 < 0.0)
        {
          // unstable calculation happens when
          // fabs(d) is very tiny and chord is
          // on the k-th side.
          break;
        }
        s0 = 0.0;
      }

      if ( s1 < 0.0 ) s1 = 0.0; else if ( s1 > 1.0 ) s1 = 1.0;
      d = (1.0-s0)*t0 + s0*t1;
      t1 = (1.0-s1)*t0 + s1*t1;
      t0 = d;
      break;
    }

    if (t0 > t1 )
    {
      line_parameters->Set(t1,t0);
    }
    else
    {
      line_parameters->Set(t0,t1);
    }
  }

  return true;
}